

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

int32_t WebRtcAgc_InitDigital(DigitalAgc *stt,int16_t agcMode)

{
  int16_t agcMode_local;
  DigitalAgc *stt_local;
  
  if (agcMode == 3) {
    stt->capacitorSlow = 0;
  }
  else {
    stt->capacitorSlow = 0x8000000;
  }
  stt->capacitorFast = 0;
  stt->gain = 0x10000;
  stt->gatePrevious = 0;
  stt->agcMode = agcMode;
  WebRtcAgc_InitVad(&stt->vadNearend);
  WebRtcAgc_InitVad(&stt->vadFarend);
  return 0;
}

Assistant:

int32_t WebRtcAgc_InitDigital(DigitalAgc *stt, int16_t agcMode) {
    if (agcMode == kAgcModeFixedDigital) {
        // start at minimum to find correct gain faster
        stt->capacitorSlow = 0;
    } else {
        // start out with 0 dB gain
        stt->capacitorSlow = 134217728;  // (int32_t)(0.125f * 32768.0f * 32768.0f);
    }
    stt->capacitorFast = 0;
    stt->gain = 65536;
    stt->gatePrevious = 0;
    stt->agcMode = agcMode;
#ifdef WEBRTC_AGC_DEBUG_DUMP
    stt->frameCounter = 0;
#endif

    // initialize VADs
    WebRtcAgc_InitVad(&stt->vadNearend);
    WebRtcAgc_InitVad(&stt->vadFarend);

    return 0;
}